

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

int ffgmng(fitsfile *mfptr,long *ngroups,int *status)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_19c;
  char *tkeyvalue;
  long grpid;
  long *local_188;
  char *inclist [1];
  char newKeyword [75];
  char keyword [75];
  char comment [73];
  char card [81];
  
  inclist[0] = "GRPID#";
  iVar1 = *status;
  if (iVar1 == 0) {
    *ngroups = 0;
    iVar1 = ffgrec(mfptr,0,card,status);
    *status = iVar1;
    iVar3 = 1;
    while (local_19c = 1, iVar1 == 0) {
      iVar1 = ffgnxk(mfptr,inclist,1,(char **)0x0,0,card,status);
      *status = iVar1;
      if (iVar1 == 0) {
        *ngroups = *ngroups + 1;
      }
    }
    if (iVar1 == 0xca) {
      *status = 0;
      iVar1 = 0;
    }
    iVar2 = 0;
    local_188 = ngroups;
    while (((long)local_19c <= *ngroups && (iVar1 == 0))) {
      snprintf(keyword,0x4b,"GRPID%d",iVar3);
      iVar1 = ffgkyj(mfptr,keyword,&grpid,card,status);
      *status = iVar1;
      if (iVar1 == 0xca) {
        *status = 0;
        iVar2 = iVar2 + 1;
        iVar1 = 0;
      }
      else {
        local_19c = local_19c + 1;
        if (0 < iVar2) {
          snprintf(newKeyword,0x4b,"GRPID%d",(ulong)(uint)(iVar3 - iVar2));
          ffmnam(mfptr,keyword,newKeyword,status);
          snprintf(keyword,0x4b,"GRPLC%d",iVar3);
          snprintf(newKeyword,0x4b,"GRPLC%d",(ulong)(uint)(iVar3 - iVar2));
          iVar1 = ffgkls(mfptr,keyword,&tkeyvalue,comment,status);
          *status = iVar1;
          if (iVar1 == 0) {
            ffdkey(mfptr,keyword,status);
            ffikls(mfptr,newKeyword,tkeyvalue,comment,status);
            ffplsw(mfptr,status);
            free(tkeyvalue);
            iVar1 = *status;
          }
          ngroups = local_188;
          if (iVar1 == 0xca) {
            *status = 0;
            iVar1 = 0;
          }
        }
      }
      iVar3 = iVar3 + 1;
    }
  }
  return iVar1;
}

Assistant:

int ffgmng(fitsfile *mfptr,   /* FITS file pointer to member HDU            */
	   long     *ngroups, /* total number of groups linked to HDU       */
	   int      *status)  /* return status code                         */

/*
  return the number of groups to which a HDU belongs, as defined by the number
  of GRPIDn/GRPLCn keyword records that appear in the HDU header. The 
  fitsfile pointer mfptr must be positioned with the member HDU as the CHDU. 
  Each time this function is called, the indicies of the GRPIDn/GRPLCn
  keywords are checked to make sure they are continuous (ie no gaps) and
  are re-enumerated to eliminate gaps if gaps are found to be present.
*/

{
  int offset;
  int index;
  int newIndex;
  int i;
  
  long grpid;

  char *inclist[] = {"GRPID#"};
  char keyword[FLEN_KEYWORD];
  char newKeyword[FLEN_KEYWORD];
  char card[FLEN_CARD];
  char comment[FLEN_COMMENT];
  char *tkeyvalue;

  if(*status != 0) return(*status);

  *ngroups = 0;

  /* reset the member HDU keyword counter to the beginning */

  *status = ffgrec(mfptr,0,card,status);
  
  /*
    search for the number of GRPIDn keywords in the member HDU header
    and count them with the ngroups variable
  */
  
  while(*status == 0)
    {
      /* read the next GRPIDn keyword in the series */

      *status = fits_find_nextkey(mfptr,inclist,1,NULL,0,card,status);
      
      if(*status != 0) continue;
      
      ++(*ngroups);
    }

  if(*status == KEY_NO_EXIST) *status = 0;
      
  /*
     read each GRPIDn/GRPLCn keyword and adjust their index values so that
     there are no gaps in the index count
  */

  for(index = 1, offset = 0, i = 1; i <= *ngroups && *status == 0; ++index)
    {	  
      snprintf(keyword,FLEN_KEYWORD,"GRPID%d",index);

      /* try to read the next GRPIDn keyword in the series */

      *status = fits_read_key_lng(mfptr,keyword,&grpid,card,status);

      /* if not found then increment the offset counter and continue */

      if(*status == KEY_NO_EXIST) 
	{
	  *status = 0;
	  ++offset;
	}
      else
	{
	  /* 
	     increment the number_keys_found counter and see if the index
	     of the keyword needs to be updated
	  */

	  ++i;

	  if(offset > 0)
	    {
	      /* compute the new index for the GRPIDn/GRPLCn keywords */
	      newIndex = index - offset;

	      /* update the GRPIDn keyword index */

	      snprintf(newKeyword,FLEN_KEYWORD,"GRPID%d",newIndex);
	      fits_modify_name(mfptr,keyword,newKeyword,status);

	      /* If present, update the GRPLCn keyword index */

	      snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",index);
	      snprintf(newKeyword,FLEN_KEYWORD,"GRPLC%d",newIndex);
	      /* SPR 1738 */
	      *status = fits_read_key_longstr(mfptr,keyword,&tkeyvalue,comment,
					      status);
	      if (0 == *status) {
		fits_delete_key(mfptr,keyword,status);
		fits_insert_key_longstr(mfptr,newKeyword,tkeyvalue,comment,status);
		fits_write_key_longwarn(mfptr,status);
		free(tkeyvalue);
	      }
	      

	      if(*status == KEY_NO_EXIST) *status = 0;
	    }
	}
    }

  return(*status);
}